

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O1

void anon_unknown.dwarf_b87ac::AssertInt8Equals
               (uint8_t expected,char *s,ParseIntTypeCombo parse_type)

{
  bool bVar1;
  size_t sVar2;
  int line;
  char *pcVar3;
  ostream *poVar4;
  uchar actual;
  AssertionResult gtest_ar;
  uint8_t local_51;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  uint8_t local_41;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  AssertHelper local_30;
  
  local_41 = expected;
  sVar2 = strlen(s);
  pcVar3 = s + sVar2;
  if (parse_type == Both) {
    local_50.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((ulong)local_50.ptr_._4_4_ << 0x20);
    local_30.data_._0_4_ = wabt::ParseInt8(s,pcVar3,&local_51,UnsignedOnly);
    testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
              (local_40,"Result::Ok","parse_int(s, end, &actual, ParseIntType::UnsignedOnly)",
               (Enum *)&local_50,(Result *)&local_30);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      poVar4 = (ostream *)(local_50.ptr_ + 0x10);
      if (s == (char *)0x0) {
        s = "(null)";
        sVar2 = 6;
      }
      else {
        sVar2 = strlen(s);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,s,sVar2);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      line = 0x2d;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                (local_40,"expected","actual",&local_41,&local_51);
      if (local_40[0] != (internal)0x0) goto LAB_001ec8bf;
      testing::Message::Message((Message *)&local_50);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      line = 0x2f;
    }
  }
  else {
    local_50.ptr_._0_4_ = 1;
    local_30.data_._0_4_ = wabt::ParseInt8(s,pcVar3,&local_51,UnsignedOnly);
    testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
              (local_40,"Result::Error","parse_int(s, end, &actual, ParseIntType::UnsignedOnly)",
               (Enum *)&local_50,(Result *)&local_30);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      poVar4 = (ostream *)(local_50.ptr_ + 0x10);
      if (s == (char *)0x0) {
        s = "(null)";
        sVar2 = 6;
      }
      else {
        sVar2 = strlen(s);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,s,sVar2);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      line = 0x32;
    }
    else {
LAB_001ec8bf:
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (parse_type - SignedAndUnsigned < 2) {
        local_50.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)local_50.ptr_._4_4_ << 0x20);
        local_30.data_._0_4_ = wabt::ParseInt8(s,pcVar3,&local_51,SignedAndUnsigned);
        testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
                  (local_40,"Result::Ok",
                   "parse_int(s, end, &actual, ParseIntType::SignedAndUnsigned)",(Enum *)&local_50,
                   (Result *)&local_30);
        if (local_40[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_50);
          poVar4 = (ostream *)(local_50.ptr_ + 0x10);
          if (s == (char *)0x0) {
            s = "(null)";
            sVar2 = 6;
          }
          else {
            sVar2 = strlen(s);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,s,sVar2);
          if (local_38.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((local_38.ptr_)->_M_dataplus)._M_p;
          }
          line = 0x38;
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                    (local_40,"expected","actual",&local_41,&local_51);
          if (local_40[0] != (internal)0x0) goto LAB_001ecc6d;
          testing::Message::Message((Message *)&local_50);
          if (local_38.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((local_38.ptr_)->_M_dataplus)._M_p;
          }
          line = 0x3a;
        }
      }
      else {
        local_50.ptr_._0_4_ = 1;
        local_30.data_._0_4_ = wabt::ParseInt8(s,pcVar3,&local_51,SignedAndUnsigned);
        testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
                  (local_40,"Result::Error",
                   "parse_int(s, end, &actual, ParseIntType::SignedAndUnsigned)",(Enum *)&local_50,
                   (Result *)&local_30);
        if (local_40[0] != (internal)0x0) goto LAB_001ecc6d;
        testing::Message::Message((Message *)&local_50);
        poVar4 = (ostream *)(local_50.ptr_ + 0x10);
        if (s == (char *)0x0) {
          s = "(null)";
          sVar2 = 6;
        }
        else {
          sVar2 = strlen(s);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,s,sVar2);
        if (local_38.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_38.ptr_)->_M_dataplus)._M_p;
        }
        line = 0x3d;
      }
    }
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_30,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-literal.cc"
             ,line,pcVar3);
  testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_50);
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  if (local_50.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_50.ptr_ + 8))();
    }
    local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
LAB_001ecc6d:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

void AssertInt8Equals(uint8_t expected,
                      const char* s,
                      ParseIntTypeCombo parse_type = Both) {
  AssertIntEquals(expected, s, ParseInt8, parse_type);
}